

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::MutablePatternModifier::getSymbol
          (UnicodeString *__return_storage_ptr__,MutablePatternModifier *this,AffixPatternType type)

{
  UErrorCode local_20;
  AffixPatternType local_1c;
  UErrorCode localStatus;
  AffixPatternType type_local;
  MutablePatternModifier *this_local;
  
  local_20 = U_ZERO_ERROR;
  local_1c = type;
  _localStatus = this;
  this_local = (MutablePatternModifier *)__return_storage_ptr__;
  switch(type) {
  case TYPE_CURRENCY_QUINT:
    UnicodeString::UnicodeString(__return_storage_ptr__,anon_var_dwarf_15164f);
    break;
  case TYPE_CURRENCY_QUAD:
    UnicodeString::UnicodeString(__return_storage_ptr__,anon_var_dwarf_15164f);
    break;
  case TYPE_CURRENCY_TRIPLE:
    CurrencySymbols::getPluralName
              (__return_storage_ptr__,this->fCurrencySymbols,this->fPlural,&local_20);
    break;
  case TYPE_CURRENCY_DOUBLE:
    CurrencySymbols::getIntlCurrencySymbol(__return_storage_ptr__,this->fCurrencySymbols,&local_20);
    break;
  case TYPE_CURRENCY_SINGLE:
    if (this->fUnitWidth == UNUM_UNIT_WIDTH_ISO_CODE) {
      CurrencySymbols::getIntlCurrencySymbol
                (__return_storage_ptr__,this->fCurrencySymbols,&local_20);
    }
    else if (this->fUnitWidth == UNUM_UNIT_WIDTH_HIDDEN) {
      UnicodeString::UnicodeString(__return_storage_ptr__);
    }
    else if (this->fUnitWidth == UNUM_UNIT_WIDTH_NARROW) {
      CurrencySymbols::getNarrowCurrencySymbol
                (__return_storage_ptr__,this->fCurrencySymbols,&local_20);
    }
    else {
      CurrencySymbols::getCurrencySymbol(__return_storage_ptr__,this->fCurrencySymbols,&local_20);
    }
    break;
  case TYPE_PERMILLE:
    DecimalFormatSymbols::getSymbol(__return_storage_ptr__,this->fSymbols,kPerMillSymbol);
    break;
  case TYPE_PERCENT:
    DecimalFormatSymbols::getSymbol(__return_storage_ptr__,this->fSymbols,kPercentSymbol);
    break;
  case TYPE_PLUS_SIGN:
    DecimalFormatSymbols::getSymbol(__return_storage_ptr__,this->fSymbols,kPlusSignSymbol);
    break;
  case TYPE_MINUS_SIGN:
    DecimalFormatSymbols::getSymbol(__return_storage_ptr__,this->fSymbols,kMinusSignSymbol);
    break;
  default:
    UnicodeString::UnicodeString(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString MutablePatternModifier::getSymbol(AffixPatternType type) const {
    UErrorCode localStatus = U_ZERO_ERROR;
    switch (type) {
        case AffixPatternType::TYPE_MINUS_SIGN:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kMinusSignSymbol);
        case AffixPatternType::TYPE_PLUS_SIGN:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPlusSignSymbol);
        case AffixPatternType::TYPE_PERCENT:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPercentSymbol);
        case AffixPatternType::TYPE_PERMILLE:
            return fSymbols->getSymbol(DecimalFormatSymbols::ENumberFormatSymbol::kPerMillSymbol);
        case AffixPatternType::TYPE_CURRENCY_SINGLE: {
            // UnitWidth ISO and HIDDEN overrides the singular currency symbol.
            if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_ISO_CODE) {
                return fCurrencySymbols->getIntlCurrencySymbol(localStatus);
            } else if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_HIDDEN) {
                return UnicodeString();
            } else if (fUnitWidth == UNumberUnitWidth::UNUM_UNIT_WIDTH_NARROW) {
                return fCurrencySymbols->getNarrowCurrencySymbol(localStatus);
            } else {
                return fCurrencySymbols->getCurrencySymbol(localStatus);
            }
        }
        case AffixPatternType::TYPE_CURRENCY_DOUBLE:
            return fCurrencySymbols->getIntlCurrencySymbol(localStatus);
        case AffixPatternType::TYPE_CURRENCY_TRIPLE:
            // NOTE: This is the code path only for patterns containing "¤¤¤".
            // Plural currencies set via the API are formatted in LongNameHandler.
            // This code path is used by DecimalFormat via CurrencyPluralInfo.
            U_ASSERT(fPlural != StandardPlural::Form::COUNT);
            return fCurrencySymbols->getPluralName(fPlural, localStatus);
        case AffixPatternType::TYPE_CURRENCY_QUAD:
            return UnicodeString(u"\uFFFD");
        case AffixPatternType::TYPE_CURRENCY_QUINT:
            return UnicodeString(u"\uFFFD");
        default:
            U_ASSERT(false);
            return UnicodeString();
    }
}